

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int cm_expat_XML_ParseBuffer(XML_Parser parser,int len,int isFinal)

{
  undefined4 uVar1;
  long local_50;
  char *start;
  int isFinal_local;
  int len_local;
  XML_Parser parser_local;
  
  *(undefined8 *)((long)parser + 0x228) = *(undefined8 *)((long)parser + 0x30);
  *(long *)((long)parser + 0x38) = *(long *)((long)parser + 0x38) + (long)len;
  *(long *)((long)parser + 0x48) = (long)len + *(long *)((long)parser + 0x48);
  *(undefined8 *)((long)parser + 0x50) = *(undefined8 *)((long)parser + 0x38);
  if (isFinal == 0) {
    local_50 = (long)parser + 0x30;
  }
  else {
    local_50 = 0;
  }
  uVar1 = (**(code **)((long)parser + 0x208))
                    (parser,*(undefined8 *)((long)parser + 0x30),
                     *(undefined8 *)((long)parser + 0x38),local_50);
  *(undefined4 *)((long)parser + 0x210) = uVar1;
  if (*(int *)((long)parser + 0x210) == 0) {
    if (isFinal == 0) {
      (**(code **)(*(long *)((long)parser + 0x118) + 0x68))
                (*(undefined8 *)((long)parser + 0x118),*(undefined8 *)((long)parser + 0x228),
                 *(undefined8 *)((long)parser + 0x30),(long)parser + 0x408);
    }
    parser_local._4_4_ = 1;
  }
  else {
    *(undefined8 *)((long)parser + 0x220) = *(undefined8 *)((long)parser + 0x218);
    *(code **)((long)parser + 0x208) = errorProcessor;
    parser_local._4_4_ = 0;
  }
  return parser_local._4_4_;
}

Assistant:

int XML_ParseBuffer(XML_Parser parser, int len, int isFinal)
{
  const char *start = bufferPtr;
  positionPtr = start;
  bufferEnd += len;
  parseEndByteIndex += len;
  errorCode = processor(parser, start, parseEndPtr = bufferEnd,
                        isFinal ? (const char **)0 : &bufferPtr);
  if (errorCode == XML_ERROR_NONE) {
    if (!isFinal)
      XmlUpdatePosition(encoding, positionPtr, bufferPtr, &position);
    return 1;
  }
  else {
    eventEndPtr = eventPtr;
    processor = errorProcessor;
    return 0;
  }
}